

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmInt.h
# Opt level: O0

Mpm_Cut_t * Mpm_ObjCutBestP(Mpm_Man_t *p,Mig_Obj_t *pObj)

{
  int h;
  Mpm_Cut_t *pMVar1;
  Mig_Obj_t *pObj_local;
  Mpm_Man_t *p_local;
  
  h = Mpm_ObjCutBest(p,pObj);
  pMVar1 = Mpm_CutFetch(p,h);
  return pMVar1;
}

Assistant:

static inline Mpm_Cut_t * Mpm_ObjCutBestP( Mpm_Man_t * p, Mig_Obj_t * pObj )             { return Mpm_CutFetch( p, Mpm_ObjCutBest(p, pObj) );              }